

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::TransitionTextureState
          (DeviceContextVkImpl *this,TextureVkImpl *TextureVk,RESOURCE_STATE OldState,
          RESOURCE_STATE NewState,STATE_TRANSITION_FLAGS Flags,VkImageSubresourceRange *pSubresRange
          )

{
  RESOURCE_STATE RVar1;
  VkBool32 VVar2;
  VkImage Image;
  VkImageLayout VVar3;
  VkImageLayout NewLayout;
  VkPipelineStageFlags SrcStages;
  VkPipelineStageFlags DstStages;
  TextureFormatAttribs *pTVar4;
  int iVar5;
  char (*Args_1) [35];
  RESOURCE_STATE extraout_EDX;
  RESOURCE_STATE State;
  RESOURCE_STATE State_00;
  undefined7 in_register_00000081;
  char (*Args_2) [64];
  char (*in_stack_ffffffffffffff38) [26];
  string msg;
  String local_78;
  String local_50;
  
  Args_2 = (char (*) [64])CONCAT71(in_register_00000081,Flags);
  State = OldState;
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              (&msg,(char (*) [55])"State transitions are not allowed inside a render pass");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"TransitionTextureState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xbc9);
    std::__cxx11::string::~string((string *)&msg);
    State = extraout_EDX;
  }
  RVar1 = (TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).m_State;
  if (OldState == RESOURCE_STATE_UNKNOWN) {
    OldState = RVar1;
    if (RVar1 == RESOURCE_STATE_UNKNOWN) {
      FormatString<char[44],char_const*,char[64]>
                (&msg,(Diligent *)"Failed to transition the state of texture \'",
                 (char (*) [44])
                 &(TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                  .m_Desc,(char **)
                          "\' because the state is unknown and is not explicitly specified.",Args_2)
      ;
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
      goto LAB_001bbe8f;
    }
  }
  else if (RVar1 != OldState && RVar1 != RESOURCE_STATE_UNKNOWN) {
    GetResourceStateString_abi_cxx11_(&local_78,(Diligent *)(ulong)RVar1,State);
    GetResourceStateString_abi_cxx11_(&local_50,(Diligent *)(ulong)OldState,State_00);
    FormatString<char[11],std::__cxx11::string,char[14],char_const*,char[32],std::__cxx11::string,char[26]>
              (&msg,(Diligent *)"The state ",(char (*) [11])&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5cf266,
               (char (*) [14])
               &(TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                .m_Desc,(char **)"\' does not match the old state ",(char (*) [32])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " specified by the barrier",in_stack_ffffffffffffff38);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_78);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  EnsureVkCmdBuffer(this);
  Image = (TextureVk->m_VulkanImage).m_VkObject;
  if (pSubresRange == (VkImageSubresourceRange *)0x0) {
    pSubresRange = (VkImageSubresourceRange *)&local_78;
    local_78.field_2._M_allocated_capacity._0_4_ = 0xffffffff;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0xffffffff;
LAB_001bbd1e:
    pTVar4 = GetTextureFormatAttribs
                       ((TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        .m_Desc.Format);
    iVar5 = (uint)(pTVar4->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) * 5 + 1;
    if (pTVar4->ComponentType == COMPONENT_TYPE_DEPTH) {
      iVar5 = 2;
    }
    *(int *)&(((String *)pSubresRange)->_M_dataplus)._M_p = iVar5;
  }
  else if (pSubresRange->aspectMask == 0) goto LAB_001bbd1e;
  VVar2 = (((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
            m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap;
  VVar3 = VK_IMAGE_LAYOUT_UNDEFINED;
  if ((Flags & STATE_TRANSITION_FLAG_DISCARD_CONTENT) == STATE_TRANSITION_FLAG_NONE) {
    VVar3 = ResourceStateToVkImageLayout(OldState,false,VVar2 != 0);
  }
  NewLayout = ResourceStateToVkImageLayout(NewState,false,VVar2 != 0);
  SrcStages = ResourceStateFlagsToVkPipelineStageFlags(OldState);
  DstStages = ResourceStateFlagsToVkPipelineStageFlags(NewState);
  if ((((OldState &
        (RESOURCE_STATE_BUILD_AS_WRITE|RESOURCE_STATE_RESOLVE_DEST|RESOURCE_STATE_COPY_DEST|
         RESOURCE_STATE_UNORDERED_ACCESS|RESOURCE_STATE_RENDER_TARGET)) == RESOURCE_STATE_UNKNOWN)
      && ((OldState & NewState) == NewState)) && (VVar3 == NewLayout)) {
    return;
  }
  Args_1 = (char (*) [35])(ulong)NewLayout;
  VulkanUtilities::VulkanCommandBuffer::TransitionImageLayout
            (&this->m_CommandBuffer,Image,VVar3,NewLayout,pSubresRange,SrcStages,DstStages);
  if ((Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) == STATE_TRANSITION_FLAG_NONE) {
    return;
  }
  (TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = NewState;
  VVar3 = TextureVkImpl::GetLayout(TextureVk);
  if (VVar3 == NewLayout) {
    return;
  }
  FormatString<char[26],char[35]>
            (&msg,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])"TextureVk.GetLayout() == NewLayout",Args_1);
  DebugAssertionFailed
            (msg._M_dataplus._M_p,"TransitionTextureState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
             ,0xc11);
LAB_001bbe8f:
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionTextureState(TextureVkImpl&           TextureVk,
                                                 RESOURCE_STATE           OldState,
                                                 RESOURCE_STATE           NewState,
                                                 STATE_TRANSITION_FLAGS   Flags,
                                                 VkImageSubresourceRange* pSubresRange /* = nullptr*/)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
    if (OldState == RESOURCE_STATE_UNKNOWN)
    {
        if (TextureVk.IsInKnownState())
        {
            OldState = TextureVk.GetState();
        }
        else
        {
            LOG_ERROR_MESSAGE("Failed to transition the state of texture '", TextureVk.GetDesc().Name, "' because the state is unknown and is not explicitly specified.");
            return;
        }
    }
    else
    {
        if (TextureVk.IsInKnownState() && TextureVk.GetState() != OldState)
        {
            LOG_ERROR_MESSAGE("The state ", GetResourceStateString(TextureVk.GetState()), " of texture '",
                              TextureVk.GetDesc().Name, "' does not match the old state ", GetResourceStateString(OldState),
                              " specified by the barrier");
        }
    }

    EnsureVkCmdBuffer();

    VkImage vkImg = TextureVk.GetVkImage();

    VkImageSubresourceRange FullSubresRange;
    if (pSubresRange == nullptr)
    {
        pSubresRange = &FullSubresRange;

        FullSubresRange.aspectMask     = 0;
        FullSubresRange.baseArrayLayer = 0;
        FullSubresRange.layerCount     = VK_REMAINING_ARRAY_LAYERS;
        FullSubresRange.baseMipLevel   = 0;
        FullSubresRange.levelCount     = VK_REMAINING_MIP_LEVELS;
    }

    if (pSubresRange->aspectMask == 0)
    {
        const TextureDesc&          TexDesc    = TextureVk.GetDesc();
        const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH)
            pSubresRange->aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
        else if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            // If image has a depth / stencil format with both depth and stencil components, then the
            // aspectMask member of subresourceRange must include both VK_IMAGE_ASPECT_DEPTH_BIT and
            // VK_IMAGE_ASPECT_STENCIL_BIT
            pSubresRange->aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
        }
        else
            pSubresRange->aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    }

    // Always add barrier after writes.
    const bool AfterWrite = ResourceStateHasWriteAccess(OldState);

    const auto&                ExtFeatures    = m_pDevice->GetLogicalDevice().GetEnabledExtFeatures();
    const bool                 FragDensityMap = ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE;
    const VkImageLayout        OldLayout      = (Flags & STATE_TRANSITION_FLAG_DISCARD_CONTENT) != 0 ? VK_IMAGE_LAYOUT_UNDEFINED : ResourceStateToVkImageLayout(OldState, /*IsInsideRenderPass = */ false, FragDensityMap);
    const VkImageLayout        NewLayout      = ResourceStateToVkImageLayout(NewState, /*IsInsideRenderPass = */ false, FragDensityMap);
    const VkPipelineStageFlags OldStages      = ResourceStateFlagsToVkPipelineStageFlags(OldState);
    const VkPipelineStageFlags NewStages      = ResourceStateFlagsToVkPipelineStageFlags(NewState);

    if (((OldState & NewState) != NewState) || OldLayout != NewLayout || AfterWrite)
    {
        m_CommandBuffer.TransitionImageLayout(vkImg, OldLayout, NewLayout, *pSubresRange, OldStages, NewStages);
        if ((Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0)
        {
            TextureVk.SetState(NewState);
            VERIFY_EXPR(TextureVk.GetLayout() == NewLayout);
        }
    }
}